

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2DeepRecursion(void)

{
  bool bVar1;
  ostream *poVar2;
  LogMessage local_2d8;
  StringPiece local_158;
  undefined1 local_148 [8];
  RE2 re;
  string local_60 [8];
  string a;
  allocator local_29;
  string local_28 [8];
  string comment;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"x*",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_60,0x20000,'a',(allocator *)((long)&re.group_names_once_._M_once + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&re.group_names_once_._M_once + 3));
  std::__cxx11::string::operator+=(local_28,local_60);
  std::__cxx11::string::operator+=(local_28,"*x");
  RE2::RE2((RE2 *)local_148,"((?:\\s|xx.*\n|x[*](?:\n|.)*?[*]x)*)");
  StringPiece::StringPiece(&local_158,(string *)local_28);
  bVar1 = RE2::FullMatch<>(&local_158,(RE2 *)local_148);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_2d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4c4);
    poVar2 = LogMessage::stream(&local_2d8);
    std::operator<<(poVar2,"Check failed: RE2::FullMatch(comment, re)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2d8);
  }
  RE2::~RE2((RE2 *)local_148);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

TEST(RE2, DeepRecursion) {
  // Test for deep stack recursion.  This would fail with a
  // segmentation violation due to stack overflow before pcre was
  // patched.
  // Again, a PCRE legacy test.  RE2 doesn't recurse.
  string comment("x*");
  string a(131072, 'a');
  comment += a;
  comment += "*x";
  RE2 re("((?:\\s|xx.*\n|x[*](?:\n|.)*?[*]x)*)");
  CHECK(RE2::FullMatch(comment, re));
}